

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_8::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  AutoCloseFd AVar2;
  int *piVar3;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  uchar *puVar4;
  MmapRange MVar5;
  Own<const_kj::WritableFileMapping> OVar6;
  Array<unsigned_char> local_68;
  Fault f;
  
  MVar5 = getMmapRange(size,in_RCX);
  pvVar1 = ::mmap((void *)0x0,MVar5.size,3,1,*(int *)(offset + 8),MVar5.offset);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    puVar4 = (uchar *)((long)pvVar1 + (size - MVar5.offset));
    local_68.disposer = (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer;
    local_68.ptr = puVar4;
    AVar2 = (AutoCloseFd)operator_new(0x20);
    local_68.ptr = (uchar *)0x0;
    local_68.size_ = 0;
    *(undefined ***)AVar2 = &PTR_get_00435468;
    *(uchar **)((long)AVar2 + 8) = puVar4;
    *(uint64_t *)((long)AVar2 + 0x10) = in_RCX;
    *(undefined8 **)((long)AVar2 + 0x18) = &(anonymous_namespace)::mmapDisposer;
    f.exception = (Exception *)0x0;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
    (this->super_DiskHandle).fd = AVar2;
    Array<unsigned_char>::~Array(&local_68);
    OVar6.ptr = extraout_RDX;
    OVar6.disposer = (Disposer *)this;
    return OVar6;
  }
  piVar3 = __errno_location();
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x1e0,*piVar3,"mmap","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }